

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O1

void column_test_common_content_access<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>,std::pair<unsigned_int,unsigned_int>>
               (Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>
                *col,set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     *setcont,vector<unsigned_int,_std::allocator<unsigned_int>_> *veccont)

{
  uint uVar1;
  _Hash_node_base *p_Var2;
  bool bVar3;
  int iVar4;
  pointer puVar5;
  __node_base_ptr p_Var6;
  _Hash_node_base *p_Var7;
  _Hash_node_base *p_Var8;
  __hash_code __code;
  ulong __code_00;
  uint uVar9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> container;
  Entry entry;
  _Rb_tree_node_base local_228;
  undefined **local_208;
  ulong local_200;
  shared_count sStack_1f8;
  _Base_ptr local_1f0;
  undefined1 local_1e8 [16];
  _Base_ptr local_1d8;
  _Rb_tree_const_iterator<std::pair<unsigned_int,_unsigned_int>_> local_1d0;
  size_t local_1c0;
  _Rb_tree_node_base local_1b8;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  undefined1 *local_160;
  undefined1 *local_158;
  char *local_150;
  char *local_148;
  size_t local_140;
  size_t local_138;
  size_t *local_130;
  size_t *local_128;
  char *local_120;
  _Base_ptr local_118;
  _Base_ptr local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  char *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  local_50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_48 = "";
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_50,0x11d);
  get_column_content_via_iterators<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>
            ((column_content<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>
              *)local_1e8,col);
  if (local_1c0 == (setcont->_M_t)._M_impl.super__Rb_tree_header._M_node_count) {
    bVar3 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<std::pair<unsigned_int,unsigned_int>>,std::_Rb_tree_const_iterator<std::pair<unsigned_int,unsigned_int>>>
                      (local_1d0,
                       (_Rb_tree_const_iterator<std::pair<unsigned_int,_unsigned_int>_>)
                       (local_1e8 + 8),
                       (setcont->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  else {
    bVar3 = false;
  }
  local_228._M_color._0_1_ = bVar3;
  local_228._M_parent = (_Base_ptr)0x0;
  local_228._M_left = (_Base_ptr)0x0;
  local_1b8._0_8_ = "get_column_content_via_iterators(col) == setcont";
  local_1b8._M_parent = (_Base_ptr)0x170cf6;
  local_200 = local_200 & 0xffffffffffffff00;
  local_208 = &PTR__lazy_ostream_0018a7e8;
  sStack_1f8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_68 = "";
  local_1f0 = &local_1b8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)&local_228._M_left);
  std::
  _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               *)local_1e8);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x11e);
  uVar9 = (uint)((ulong)((long)(veccont->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(veccont->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start) >> 2);
  if ((int)uVar9 < 0) {
    if ((col->column_)._M_h._M_element_count == 0) {
      local_228._0_8_ = (_Base_ptr)0x0;
      local_228._M_parent = (_Base_ptr)0x0;
      local_228._M_left = (_Base_ptr)0x0;
      goto LAB_00130c2d;
    }
    p_Var8 = (col->column_)._M_h._M_before_begin._M_nxt;
    if (p_Var8 != (_Hash_node_base *)0x0) {
      p_Var2 = p_Var8->_M_nxt;
      for (; p_Var2 != (_Hash_node_base *)0x0; p_Var2 = p_Var2->_M_nxt) {
        p_Var7 = p_Var2;
        if (*(uint *)((long)&(p_Var2[1]._M_nxt)->_M_nxt + 4) <=
            *(uint *)((long)&(p_Var8[1]._M_nxt)->_M_nxt + 4)) {
          p_Var7 = p_Var8;
        }
        p_Var8 = p_Var7;
      }
    }
    uVar9 = *(int *)((long)&(p_Var8[1]._M_nxt)->_M_nxt + 4) + 1;
  }
  local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffff00000000;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_228,(long)(int)uVar9,
             (value_type_conflict *)local_1e8,(allocator_type *)&local_1b8);
  for (p_Var8 = (col->column_)._M_h._M_before_begin._M_nxt; p_Var8 != (_Hash_node_base *)0x0;
      p_Var8 = p_Var8->_M_nxt) {
    uVar1 = *(uint *)((long)&(p_Var8[1]._M_nxt)->_M_nxt + 4);
    if (uVar1 < uVar9) {
      ((_Rb_tree_color *)local_228._0_8_)[uVar1] = *(_Rb_tree_color *)&(p_Var8[1]._M_nxt)->_M_nxt;
    }
  }
LAB_00130c2d:
  puVar5 = (veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)local_228._M_parent - local_228._0_8_ ==
      (long)(veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar5) {
    if (local_228._M_parent == (_Base_ptr)local_228._0_8_) {
      bVar3 = true;
    }
    else {
      iVar4 = bcmp((void *)local_228._0_8_,puVar5,(long)local_228._M_parent - local_228._0_8_);
      bVar3 = iVar4 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  local_208 = (undefined **)CONCAT71(local_208._1_7_,bVar3);
  local_200 = 0;
  sStack_1f8.pi_ = (sp_counted_base *)0x0;
  local_1b8._0_8_ = "col.get_content(veccont.size()) == veccont";
  local_1b8._M_parent = (_Base_ptr)0x170d21;
  local_1e8[8] = _S_red;
  local_1e8._0_8_ = &PTR__lazy_ostream_0018a7e8;
  local_1d8 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_98 = "";
  local_1d0._M_node = &local_1b8;
  boost::test_tools::tt_detail::report_assertion(&local_208,local_1e8,&local_a0,0x11e,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_1f8);
  if ((_Base_ptr)local_228._0_8_ != (_Base_ptr)0x0) {
    operator_delete((void *)local_228._0_8_,(long)local_228._M_left - local_228._0_8_);
  }
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_a8 = "";
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0x120);
  local_228._M_parent = (_Base_ptr)((ulong)local_228._M_parent & 0xffffffffffffff00);
  local_228._0_8_ = &PTR__lazy_ostream_0018a7a8;
  local_228._M_left = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_228._M_right = (_Base_ptr)0x16d249;
  local_138 = (col->column_)._M_h._M_element_count;
  local_128 = &local_138;
  local_140 = (setcont->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  local_1b8._M_color._0_1_ = local_138 == local_140;
  local_130 = &local_140;
  local_1b8._M_parent = (_Base_ptr)0x0;
  local_1b8._M_left = (_Base_ptr)0x0;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_1d0._M_node = (_Base_ptr)&local_128;
  local_1e8[8] = _S_red;
  local_1e8._0_8_ = &PTR__lazy_ostream_0018a6f0;
  local_1d8 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_1f0 = (_Base_ptr)&local_130;
  local_200 = local_200 & 0xffffffffffffff00;
  local_208 = &PTR__lazy_ostream_0018a6f0;
  sStack_1f8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_1b8,&local_228,&local_40,0x120,1,2,2,"col.size()",local_1e8,"setcont.size()",
             &local_208);
  boost::detail::shared_count::~shared_count((shared_count *)&local_1b8._M_left);
  if ((veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    local_d0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_c8 = "";
    local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x124);
    local_208 = (undefined **)CONCAT71(local_208._1_7_,(col->column_)._M_h._M_element_count == 0);
    local_200 = 0;
    sStack_1f8.pi_ = (sp_counted_base *)0x0;
    local_228._0_8_ = "col.is_empty()";
    local_228._M_parent = (_Base_ptr)0x170d40;
    local_1e8[8] = _S_red;
    local_1e8._0_8_ = &PTR__lazy_ostream_0018a7e8;
    local_1d8 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
    local_f0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_e8 = "";
    local_1d0._M_node = &local_228;
    boost::test_tools::tt_detail::report_assertion();
  }
  else {
    local_100 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_f8 = "";
    local_110 = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
    local_108 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x126);
    local_208 = (undefined **)CONCAT71(local_208._1_7_,(col->column_)._M_h._M_element_count != 0);
    local_200 = 0;
    sStack_1f8.pi_ = (sp_counted_base *)0x0;
    local_228._0_8_ = "!col.is_empty()";
    local_228._M_parent = (_Base_ptr)0x170d40;
    local_1e8[8] = _S_red;
    local_1e8._0_8_ = &PTR__lazy_ostream_0018a7e8;
    local_1d8 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
    local_120 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_118 = (_Base_ptr)0x16d33e;
    local_1d0._M_node = &local_228;
    boost::test_tools::tt_detail::report_assertion();
  }
  boost::detail::shared_count::~shared_count(&sStack_1f8);
  puVar5 = (veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar5) {
    uVar9 = 1;
    __code_00 = 0;
    do {
      if (puVar5[__code_00] == 0) {
        local_150 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_148 = "";
        local_160 = &boost::unit_test::basic_cstring<char_const>::null;
        local_158 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_150,0x12a,
                   &local_160);
        local_1e8._0_8_ = (ulong)(uVar9 - 1) << 0x20;
        local_228._0_8_ = local_1e8;
        p_Var6 = std::
                 _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::_M_find_before_node
                           (&(col->column_)._M_h,__code_00 % (col->column_)._M_h._M_bucket_count,
                            (key_type *)&local_228,__code_00);
        if (p_Var6 == (__node_base_ptr)0x0) {
          bVar3 = true;
        }
        else {
          bVar3 = p_Var6->_M_nxt == (_Hash_node_base *)0x0;
        }
        local_208 = (undefined **)CONCAT71(local_208._1_7_,bVar3);
        local_200 = 0;
        sStack_1f8.pi_ = (sp_counted_base *)0x0;
        local_228._0_8_ = "!col.is_non_zero(i)";
        local_228._M_parent = (_Base_ptr)0x170d54;
        local_1e8[8] = _S_red;
        local_1e8._0_8_ = &PTR__lazy_ostream_0018a7e8;
        local_1d8 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
        local_170 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_168 = "";
        local_1d0._M_node = &local_228;
        boost::test_tools::tt_detail::report_assertion(&local_208,local_1e8,&local_170,0x12a,1,0,0);
      }
      else {
        local_180 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_178 = "";
        local_190 = &boost::unit_test::basic_cstring<char_const>::null;
        local_188 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_180,300,&local_190)
        ;
        local_1e8._0_8_ = (ulong)(uVar9 - 1) << 0x20;
        local_228._0_8_ = local_1e8;
        bVar3 = false;
        p_Var6 = std::
                 _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Chain_col_options<false,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 ::_M_find_before_node
                           (&(col->column_)._M_h,__code_00 % (col->column_)._M_h._M_bucket_count,
                            (key_type *)&local_228,__code_00);
        if (p_Var6 != (__node_base_ptr)0x0) {
          bVar3 = p_Var6->_M_nxt != (_Hash_node_base *)0x0;
        }
        local_208 = (undefined **)CONCAT71(local_208._1_7_,bVar3);
        local_200 = 0;
        sStack_1f8.pi_ = (sp_counted_base *)0x0;
        local_228._0_8_ = "col.is_non_zero(i)";
        local_228._M_parent = (_Base_ptr)0x170d54;
        local_1e8[8] = _S_red;
        local_1e8._0_8_ = &PTR__lazy_ostream_0018a7e8;
        local_1d8 = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
        local_1b8._M_right = (_Base_ptr)0x16d2cb;
        local_198 = "";
        local_1d0._M_node = &local_228;
        boost::test_tools::tt_detail::report_assertion
                  (&local_208,local_1e8,&local_1b8._M_right,300,1,0,0);
      }
      boost::detail::shared_count::~shared_count(&sStack_1f8);
      __code_00 = (ulong)uVar9;
      puVar5 = (veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar9 = uVar9 + 1;
    } while (__code_00 <
             (ulong)((long)(veccont->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           )._M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >> 2));
  }
  return;
}

Assistant:

void column_test_common_content_access(Column& col,
                                       const std::set<entry_type>& setcont,
                                       const std::vector<typename Column::Field_element>& veccont) {
  BOOST_CHECK(get_column_content_via_iterators(col) == setcont);
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(col.size(), setcont.size());
  }

  if (veccont.empty())
    BOOST_CHECK(col.is_empty());
  else
    BOOST_CHECK(!col.is_empty());

  for (unsigned int i = 0; i < veccont.size(); ++i) {
    if (veccont[i] == 0u)
      BOOST_CHECK(!col.is_non_zero(i));
    else
      BOOST_CHECK(col.is_non_zero(i));
  }
}